

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrref.h
# Opt level: O0

void __thiscall StringRef::append(StringRef *this,char *s,long l)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  undefined8 local_30;
  
  if (*(long *)(in_RDI + 0x20) < (long)(*(long *)(in_RDI + 0x18) + in_RDX)) {
    if ((long)(*(long *)(in_RDI + 0x18) + in_RDX) < 0x201) {
      local_30 = 0x100;
    }
    else {
      local_30 = (long)(*(long *)(in_RDI + 0x18) + in_RDX) / 2;
    }
    *(size_t *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x18) + in_RDX + local_30;
    pvVar1 = realloc(*(void **)(in_RDI + 0x10),*(long *)(in_RDI + 0x20) + 1);
    *(void **)(in_RDI + 0x10) = pvVar1;
  }
  memcpy((void *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18)),in_RSI,in_RDX);
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18) + in_RDX) = 0;
  *(size_t *)(in_RDI + 0x18) = in_RDX + *(long *)(in_RDI + 0x18);
  return;
}

Assistant:

void append(const char *s, long l)
    {
        /* if necessary, reallocate the buffer */
        if (len + l > alo)
        {
            /* 
             *   calculate the expansion size: go to the needed length plus
             *   half again that total for headroom, with minimum headroom of
             *   256 bytes 
             */
            alo = len + l + (len+l > 512 ? (len+l)/2 : 256);

            /* allocate the new buffer */
            str = (char *)t3realloc(str, alo + 1);
        }

        /* copy the new text */
        memcpy(str + len, s, l);

        /* null-terminate it */
        str[len + l] = '\0';

        /* note the new length */
        len += l;
    }